

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O1

void __thiscall
blockencodings_tests::TransactionsRequestDeserializationMaxTest::test_method
          (TransactionsRequestDeserializationMaxTest *this)

{
  long lVar1;
  size_t in_RCX;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  long local_1a8;
  long local_1a0;
  lazy_ostream local_198;
  undefined1 *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  DataStream local_158;
  pointer local_130;
  undefined **local_128;
  undefined1 local_120;
  undefined1 *local_118;
  pointer *local_110;
  pointer local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined1 *local_f0;
  pointer *local_e8;
  char *local_e0;
  char *local_d8;
  assertion_result local_d0;
  BlockTransactionsRequest req1;
  BlockTransactionsRequest req0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output.m_size = 0x20;
  output.m_data = (byte *)&req1;
  FastRandomContext::fillrand
            (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_rng,output);
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x10];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x11];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x12];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x13];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x14];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x15];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x16];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x17];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x18];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x19];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[1] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[1];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[2] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[2];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[3] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[3];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[4] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[4];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[5] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[5];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[6] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[6];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[7] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[7];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[8] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[8];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[9] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[9];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[10] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[10];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
  req0.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] =
       req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&req0.indexes,1);
  *req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
   super__Vector_impl_data._M_start = 0xffff;
  local_158.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.m_read_pos = 0;
  local_158.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BlockTransactionsRequest::
  SerializationOps<DataStream,BlockTransactionsRequest_const,ActionSerialize>();
  req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  req1.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DataStream::read(&local_158,(int)&req1,(void *)0x20,in_RCX);
  VectorFormatter<DifferenceFormatter>::
  Unser<DataStream,std::vector<unsigned_short,std::allocator<unsigned_short>>>
            ((VectorFormatter<DifferenceFormatter> *)&local_100,&local_158,&req1.indexes);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x187;
  file.m_begin = (iterator)&local_168;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_178,msg);
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_1a0 = (long)req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 1;
  local_108 = (pointer)&local_1a0;
  local_1a8 = (long)req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 1;
  local_130 = (pointer)&local_1a8;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a0 == local_1a8);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_d8 = "";
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_013abb70;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_013abb70;
  local_118 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_110 = &local_130;
  local_e8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_198,1,2,REQUIRE,0xe62eed,(size_t)&local_e0,0x187,&local_100,
             "req1.indexes.size()",&local_128);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x188;
  file_00.m_begin = (iterator)&local_1b8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
             msg_00);
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start ==
       *req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_d8 = "";
  local_108 = req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_013ac808;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_130 = req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_013ac808;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = &local_130;
  local_e8 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_198,1,2,REQUIRE,0xe62f01,(size_t)&local_e0,0x188,&local_100,
             "req1.indexes[0]",&local_128);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  if (req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(req1.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)req1.indexes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)req1.indexes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_158);
  if (req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(req0.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)req0.indexes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)req0.indexes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(TransactionsRequestDeserializationMaxTest) {
    // Check that the highest legal index is decoded correctly
    BlockTransactionsRequest req0;
    req0.blockhash = m_rng.rand256();
    req0.indexes.resize(1);
    req0.indexes[0] = 0xffff;
    DataStream stream{};
    stream << req0;

    BlockTransactionsRequest req1;
    stream >> req1;
    BOOST_CHECK_EQUAL(req0.indexes.size(), req1.indexes.size());
    BOOST_CHECK_EQUAL(req0.indexes[0], req1.indexes[0]);
}